

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

char * DefaultLogDir(void)

{
  char *env;
  
  env = getenv("GOOGLE_LOG_DIR");
  if (((env == (char *)0x0) || (*env == '\0')) &&
     ((env = getenv("TEST_TMPDIR"), env == (char *)0x0 || (*env == '\0')))) {
    env = "";
  }
  return env;
}

Assistant:

static const char* DefaultLogDir() {
  const char* env;
  env = getenv("GOOGLE_LOG_DIR");
  if (env != NULL && env[0] != '\0') {
    return env;
  }
  env = getenv("TEST_TMPDIR");
  if (env != NULL && env[0] != '\0') {
    return env;
  }
  return "";
}